

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<FunctionDef>::growAppend
          (QCommonArrayOps<FunctionDef> *this,FunctionDef *b,FunctionDef *e)

{
  long lVar1;
  bool bVar2;
  FunctionDef *e_00;
  FunctionDef *in_RDX;
  FunctionDef *in_RSI;
  QGenericArrayOps<FunctionDef> *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  DataPointer old;
  QCommonArrayOps<FunctionDef> *c;
  GrowthPosition where;
  FunctionDef *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != in_RDX) {
    e_00 = (FunctionDef *)(((long)in_RDX - (long)in_RSI) / 0xd0);
    c = (QCommonArrayOps<FunctionDef> *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (FunctionDef *)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<FunctionDef>::QArrayDataPointer
              ((QArrayDataPointer<FunctionDef> *)&stack0xffffffffffffffd8);
    bVar2 = q_points_into_range<QtPrivate::QCommonArrayOps<FunctionDef>,FunctionDef_const*>
                      ((FunctionDef **)this_00,c);
    where = (GrowthPosition)((ulong)c >> 0x20);
    if (bVar2) {
      QArrayDataPointer<FunctionDef>::detachAndGrow
                ((QArrayDataPointer<FunctionDef> *)this_00,where,(qsizetype)in_RDI,
                 (FunctionDef **)in_RDX,(QArrayDataPointer<FunctionDef> *)e_00);
    }
    else {
      QArrayDataPointer<FunctionDef>::detachAndGrow
                ((QArrayDataPointer<FunctionDef> *)this_00,where,(qsizetype)in_RDI,
                 (FunctionDef **)in_RDX,(QArrayDataPointer<FunctionDef> *)e_00);
    }
    QGenericArrayOps<FunctionDef>::copyAppend(in_RDI,in_RDX,e_00);
    QArrayDataPointer<FunctionDef>::~QArrayDataPointer((QArrayDataPointer<FunctionDef> *)e_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }